

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

void __thiscall Bstrlib::CBString::CBString(CBString *this,CBStringList *l,uchar sep)

{
  long lVar1;
  uchar *puVar2;
  CBStringException *this_00;
  int iVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  CBStringException bstr__cppwrapper_exception;
  string local_78;
  CBStringException local_58;
  
  this->_vptr_CBString = (_func_int **)&PTR__CBString_001a9850;
  lVar8 = *(long *)l;
  lVar5 = *(long *)(l + 8);
  if (lVar5 - lVar8 == 0) {
    iVar3 = 1;
  }
  else {
    lVar1 = (lVar5 - lVar8 >> 3) * -0x5555555555555555;
    lVar1 = lVar1 + (ulong)(lVar1 == 0);
    piVar4 = (int *)(lVar8 + 0xc);
    iVar3 = 1;
    do {
      iVar3 = iVar3 + *piVar4 + 1;
      piVar4 = piVar4 + 6;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  (this->super_tagbstring).mlen = iVar3;
  (this->super_tagbstring).slen = 0;
  puVar2 = (uchar *)malloc((long)iVar3);
  (this->super_tagbstring).data = puVar2;
  if (puVar2 == (uchar *)0x0) {
LAB_00158345:
    (this->super_tagbstring).mlen = 0;
    (this->super_tagbstring).slen = 0;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"CBString::Failure in (CBStringList) constructor","");
    CBStringException::CBStringException(&local_58,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(this_00,&local_58);
    __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  if (lVar5 != lVar8) {
    lVar1 = 0;
    uVar7 = 0;
    do {
      if (uVar7 != 0) {
        operator+=(this,sep);
        lVar8 = *(long *)l;
        lVar5 = *(long *)(l + 8);
      }
      uVar6 = (lVar5 - lVar8 >> 3) * -0x5555555555555555;
      if (uVar6 < uVar7 || uVar6 - uVar7 == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7
                   ,uVar6);
        goto LAB_00158345;
      }
      operator+=(this,(CBString *)(lVar8 + lVar1));
      uVar7 = uVar7 + 1;
      lVar8 = *(long *)l;
      lVar5 = *(long *)(l + 8);
      lVar1 = lVar1 + 0x18;
    } while (uVar7 < (ulong)((lVar5 - lVar8 >> 3) * -0x5555555555555555));
  }
  return;
}

Assistant:

CBString::CBString (const struct CBStringList& l, unsigned char sep) {
int c;
size_t i;

	for (c=1, i=0; i < l.size(); i++) {
		c += l.at(i).slen + 1;
	}

	mlen = c;
	slen = 0;
	data = (unsigned char *) bstr__alloc (mlen);
	if (!data) {
		mlen = slen = 0;
		bstringThrow ("Failure in (CBStringList) constructor");
	} else {
		for (i=0; i < l.size(); i++) {
			if (i > 0) *this += sep;
			*this += l.at(i);
		}
	}
}